

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::Own<kj::AsyncIoStream>_>
kj::anon_unknown_30::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs)

{
  SocketAddress *pSVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  TransformPromiseNodeBase *this;
  PromiseNode *extraout_RDX;
  size_t in_R8;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar4;
  Own<kj::_::PromiseNode> local_348;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs_local;
  Own<kj::_::PromiseNode> local_310;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> **local_300;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *local_2f8;
  SocketAddress *local_2f0;
  NetworkFilter *local_2e8;
  Fault f;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 local_2d8;
  NullableValue<kj::Exception> local_180;
  
  addrs_local.ptr = (SocketAddress *)addrs.size_;
  local_310.ptr = (PromiseNode *)&local_348;
  if (in_R8 != 0) {
    local_2f8 = &addrs_local;
    local_300 = &local_2f8;
    local_348.disposer = (Disposer *)0x0;
    local_348.ptr = (PromiseNode *)0x0;
    local_310.disposer = (Disposer *)&PTR_run_0067b9d0;
    addrs_local.size_ = in_R8;
    local_2f0 = addrs.ptr;
    local_2e8 = filter;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_180,(Runnable *)&local_310);
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&f,&local_180);
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_180);
    if ((char)f.exception == '\x01') {
      Promise<kj::Own<kj::AsyncIoStream>_>::Promise
                ((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_180,&local_2d8.value);
      Own<kj::_::PromiseNode>::operator=(&local_348,(Own<kj::_::PromiseNode> *)&local_180);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_180);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
    pSVar1 = addrs_local.ptr;
    this = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_348,
               kj::_::
               TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1256:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1259:8)>
               ::anon_class_1_0_00000001_for_func::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067ba00;
    this[1].dependency.disposer = (Disposer *)filter;
    this[1].dependency.ptr = (PromiseNode *)addrs.ptr;
    this[1].continuationTracePtr = pSVar1;
    this[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)addrs_local.size_;
    f.exception = (Exception *)
                  &kj::_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>>,kj::Own<kj::AsyncIoStream>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::{lambda(kj::Own<kj::AsyncIoStream>&&)#1},kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>)::{lambda(kj::Exception&&)#1}>>
                   ::instance;
    local_2d8.value.ownFile.content.ptr = (char *)this;
    kj::_::maybeChain<kj::Own<kj::AsyncIoStream>>
              (&local_310,(Promise<kj::Own<kj::AsyncIoStream>_> *)&f);
    pPVar3 = local_310.ptr;
    pDVar2 = local_310.disposer;
    local_180._0_8_ = local_310.disposer;
    local_310.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_310);
    lowLevel->_vptr_LowLevelAsyncIoProvider = (_func_int **)pDVar2;
    lowLevel[1]._vptr_LowLevelAsyncIoProvider = (_func_int **)pPVar3;
    local_180.field_1.value.ownFile.content.ptr = (char *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_180);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    Own<kj::_::PromiseNode>::dispose(&local_348);
    PVar4.super_PromiseBase.node.ptr = extraout_RDX;
    PVar4.super_PromiseBase.node.disposer = (Disposer *)lowLevel;
    return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar4.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x4de,FAILED,"addrs.size() > 0","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static Promise<Own<AsyncIoStream>> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        int fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            fd, addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([](Own<AsyncIoStream>&& stream) -> Promise<Own<AsyncIoStream>> {
      // Success, pass along.
      return kj::mv(stream);
    }, [&lowLevel,&filter,addrs](Exception&& exception) mutable -> Promise<Own<AsyncIoStream>> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()));
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }